

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc_wrapper.cpp
# Opt level: O1

size_t duckdb::Utf8Proc::GraphemeCount(char *input_data,size_t input_size)

{
  size_t sVar1;
  GraphemeClusterIterator __begin1;
  GraphemeClusterIterator __end1;
  GraphemeClusterIterator local_50;
  GraphemeClusterIterator local_30;
  
  GraphemeIterator::GraphemeIterator((GraphemeIterator *)&local_50,input_data,input_size);
  GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator
            (&local_50,local_50.s,local_50.len);
  sVar1 = 0;
  GraphemeIterator::GraphemeClusterIterator::GraphemeClusterIterator(&local_30,(char *)0x0,0);
  while ((((local_50.len != local_30.len || (local_50.s != local_30.s)) ||
          (local_50.cluster.start != local_30.cluster.start)) ||
         (local_50.cluster.end != local_30.cluster.end))) {
    GraphemeIterator::GraphemeClusterIterator::operator*(&local_50);
    sVar1 = sVar1 + 1;
    GraphemeIterator::GraphemeClusterIterator::Next(&local_50);
  }
  return sVar1;
}

Assistant:

size_t Utf8Proc::GraphemeCount(const char *input_data, size_t input_size) {
	size_t num_characters = 0;
	for (auto cluster : Utf8Proc::GraphemeClusters(input_data, input_size)) {
		(void)cluster;
		num_characters++;
	}
	return num_characters;
}